

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_read(ma_vfs *pVFS,ma_vfs_file file,void *pDst,size_t sizeInBytes,size_t *pBytesRead
                     )

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  size_t bytesRead;
  ma_result result;
  ma_vfs_callbacks *pCallbacks;
  long local_48;
  ma_result local_3c;
  long *local_30;
  long local_28;
  ma_result local_4;
  
  local_48 = 0;
  if (in_R8 != (long *)0x0) {
    *in_R8 = 0;
  }
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_3c = (**(code **)(in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,in_RCX,&local_48);
    if (local_30 != (long *)0x0) {
      *local_30 = local_48;
    }
    if (((local_3c == MA_SUCCESS) && (local_48 == 0)) && (local_28 != 0)) {
      local_3c = MA_AT_END;
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_vfs_read(ma_vfs* pVFS, ma_vfs_file file, void* pDst, size_t sizeInBytes, size_t* pBytesRead)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;
    ma_result result;
    size_t bytesRead = 0;

    if (pBytesRead != NULL) {
        *pBytesRead = 0;
    }

    if (pVFS == NULL || file == NULL || pDst == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onRead == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pCallbacks->onRead(pVFS, file, pDst, sizeInBytes, &bytesRead);

    if (pBytesRead != NULL) {
        *pBytesRead = bytesRead;
    }

    if (result == MA_SUCCESS && bytesRead == 0 && sizeInBytes > 0) {
        result  = MA_AT_END;
    }

    return result;
}